

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_LABEL(Context *ctx)

{
  RegisterList *pRVar1;
  size_t in_RCX;
  char *pcVar2;
  char src0 [64];
  
  make_METAL_srcarg_string_masked(ctx,0,src0,in_RCX);
  pRVar1 = reglist_find(&ctx->used_registers,REG_TYPE_LABEL,ctx->source_args[0].regnum);
  if (ctx->output != ctx->subroutines) {
    __assert_fail("ctx->output == ctx->subroutines",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1567,"void emit_METAL_LABEL(Context *)");
  }
  if (ctx->indent != 0) {
    __assert_fail("ctx->indent == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1568,"void emit_METAL_LABEL(Context *)");
  }
  if (pRVar1 == (RegisterList *)0x0) {
    set_output(ctx,&ctx->ignore);
    pcVar2 = "";
  }
  else {
    pcVar2 = "";
    if (pRVar1->misc == 1) {
      pcVar2 = "int aL";
    }
  }
  output_line(ctx,"static void %s(%s)",src0,pcVar2);
  output_line(ctx,"{");
  ctx->indent = ctx->indent + 1;
  return;
}

Assistant:

static void emit_METAL_LABEL(Context *ctx)
{
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    const int label = ctx->source_args[0].regnum;
    RegisterList *reg = reglist_find(&ctx->used_registers, REG_TYPE_LABEL, label);
    assert(ctx->output == ctx->subroutines);  // not mainline, etc.
    assert(ctx->indent == 0);  // we shouldn't be in the middle of a function.

    // MSDN specs say CALL* has to come before the LABEL, so we know if we
    //  can ditch the entire function here as unused.
    if (reg == NULL)
        set_output(ctx, &ctx->ignore);  // Func not used. Parse, but don't output.

    // !!! FIXME: it would be nice if we could determine if a function is
    // !!! FIXME:  only called once and, if so, forcibly inline it.

    // !!! FIXME: this worked in GLSL because all our state is global to the shader,
    // !!! FIXME:  but in metal we kept it local to the shader mainline.
    // !!! FIXME:  Can we do C++11 lambdas in Metal to have nested functions?  :)

    const char *uses_loopreg = ((reg) && (reg->misc == 1)) ? "int aL" : "";
    output_line(ctx, "static void %s(%s)", src0, uses_loopreg);
    output_line(ctx, "{");
    ctx->indent++;
}